

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool jsonip::parser::plus_<jsonip::parser::digit_>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  Reader *pRVar1;
  char *pcVar2;
  size_t sVar3;
  PositionType pcVar4;
  PositionType pcVar5;
  PositionType pcVar6;
  bool bVar7;
  
  pRVar1 = state->reader_;
  pcVar5 = pRVar1->buf_;
  pcVar2 = pRVar1->pos_;
  sVar3 = pRVar1->len_;
  if ((long)pcVar2 - (long)pcVar5 == sVar3) {
    bVar7 = false;
  }
  else {
    bVar7 = (byte)(*pcVar2 - 0x30U) < 10;
    if (bVar7) {
      pRVar1->pos_ = pcVar2 + 1;
      bVar7 = true;
    }
  }
  if ((bVar7 != false) && (pcVar4 = pRVar1->pos_, (long)pcVar4 - (long)pcVar5 != sVar3)) {
    pcVar5 = pcVar5 + (sVar3 - (long)pcVar4);
    pcVar6 = (PositionType)0x0;
    while ((byte)(pcVar4[(long)pcVar6] - 0x30U) < 10) {
      pRVar1->pos_ = pcVar4 + (long)(pcVar6 + 1);
      if (pcVar5 + -1 == pcVar6) {
        return bVar7;
      }
      if (9 < (byte)(pcVar4[(long)(pcVar6 + 1)] - 0x30U)) {
        return bVar7;
      }
      pRVar1->pos_ = pcVar4 + (long)(pcVar6 + 2);
      if (pcVar5 + -2 == pcVar6) {
        return bVar7;
      }
      if (9 < (byte)(pcVar4[(long)(pcVar6 + 2)] - 0x30U)) {
        return bVar7;
      }
      pRVar1->pos_ = pcVar4 + (long)(pcVar6 + 3);
      if (pcVar5 + -3 == pcVar6) {
        return bVar7;
      }
      if (9 < (byte)(pcVar4[(long)(pcVar6 + 3)] - 0x30U)) {
        return bVar7;
      }
      pRVar1->pos_ = pcVar4 + (long)(pcVar6 + 4);
      if (pcVar5 + -4 == pcVar6) {
        return bVar7;
      }
      if (9 < (byte)(pcVar4[(long)(pcVar6 + 4)] - 0x30U)) {
        return bVar7;
      }
      pRVar1->pos_ = pcVar4 + (long)(pcVar6 + 5);
      if (pcVar5 + -5 == pcVar6) {
        return bVar7;
      }
      if (9 < (byte)(pcVar4[(long)(pcVar6 + 5)] - 0x30U)) {
        return bVar7;
      }
      pRVar1->pos_ = pcVar4 + (long)(pcVar6 + 6);
      if (pcVar5 + -6 == pcVar6) {
        return bVar7;
      }
      if (9 < (byte)(pcVar4[(long)(pcVar6 + 6)] - 0x30U)) {
        return bVar7;
      }
      pRVar1->pos_ = pcVar4 + (long)(pcVar6 + 7);
      if (pcVar5 + -7 == pcVar6) {
        return bVar7;
      }
      if (9 < (byte)(pcVar4[(long)(pcVar6 + 7)] - 0x30U)) {
        return bVar7;
      }
      pRVar1->pos_ = pcVar4 + (long)(pcVar6 + 8);
      if (pcVar5 + -8 == pcVar6) {
        return bVar7;
      }
      if (9 < (byte)(pcVar4[(long)(pcVar6 + 8)] - 0x30U)) {
        return bVar7;
      }
      pRVar1->pos_ = pcVar4 + (long)(pcVar6 + 9);
      if (pcVar5 + -9 == pcVar6) {
        return bVar7;
      }
      if (9 < (byte)(pcVar4[(long)(pcVar6 + 9)] - 0x30U)) {
        return bVar7;
      }
      pRVar1->pos_ = pcVar4 + (long)(pcVar6 + 10);
      pcVar6 = pcVar6 + 10;
      if (pcVar5 == pcVar6) {
        return bVar7;
      }
    }
  }
  return bVar7;
}

Assistant:

static inline bool match(S& state)
        {
            if (!C0::match(state)) return false;
            // Note: yes, I unroll this loop intentionally
            while (C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state))
                ;
            return true;
        }